

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O2

boolean set_quality_ratings(j_compress_ptr cinfo,char *arg,boolean force_baseline)

{
  char cVar1;
  boolean bVar2;
  j_compress_ptr pjVar3;
  int iVar4;
  long lVar5;
  char ch;
  int val;
  boolean local_3c;
  j_compress_ptr local_38;
  
  val = 0x4b;
  lVar5 = 0;
  local_3c = force_baseline;
  local_38 = cinfo;
  do {
    pjVar3 = local_38;
    bVar2 = local_3c;
    if (lVar5 == 4) {
      jpeg_add_quant_table(local_38,0,std_luminance_quant_tbl,q_scale_factor[0],local_3c);
      jpeg_add_quant_table(pjVar3,1,std_chrominance_quant_tbl,q_scale_factor[1],bVar2);
      return 1;
    }
    if (*arg == '\0') {
      iVar4 = jpeg_quality_scaling(val);
      q_scale_factor[lVar5] = iVar4;
    }
    else {
      ch = ',';
      iVar4 = __isoc99_sscanf(arg,"%d%c",&val,&ch);
      if (iVar4 < 1) {
        return 0;
      }
      if (ch != ',') {
        return 0;
      }
      iVar4 = jpeg_quality_scaling(val);
      q_scale_factor[lVar5] = iVar4;
      do {
        cVar1 = *arg;
        if (cVar1 == '\0') break;
        arg = arg + 1;
      } while (cVar1 != ',');
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

GLOBAL(boolean)
set_quality_ratings(j_compress_ptr cinfo, char *arg, boolean force_baseline)
/* Process a quality-ratings parameter string, of the form
 *     N[,N,...]
 * If there are more q-table slots than parameters, the last value is replicated.
 */
{
  int val = 75;                 /* default value */
  int tblno;
  char ch;

  for (tblno = 0; tblno < NUM_QUANT_TBLS; tblno++) {
    if (*arg) {
      ch = ',';                 /* if not set by sscanf, will be ',' */
      if (sscanf(arg, "%d%c", &val, &ch) < 1)
        return FALSE;
      if (ch != ',')            /* syntax check */
        return FALSE;
      /* Convert user 0-100 rating to percentage scaling */
#if JPEG_LIB_VERSION >= 70
      cinfo->q_scale_factor[tblno] = jpeg_quality_scaling(val);
#else
      q_scale_factor[tblno] = jpeg_quality_scaling(val);
#endif
      while (*arg && *arg++ != ','); /* advance to next segment of arg
                                        string */
    } else {
      /* reached end of parameter, set remaining factors to last value */
#if JPEG_LIB_VERSION >= 70
      cinfo->q_scale_factor[tblno] = jpeg_quality_scaling(val);
#else
      q_scale_factor[tblno] = jpeg_quality_scaling(val);
#endif
    }
  }
  jpeg_default_qtables(cinfo, force_baseline);
  return TRUE;
}